

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-rinex.c
# Opt level: O0

int read_observation_records(ingest_info *info)

{
  int iVar1;
  long lVar2;
  coda_mem_record *pcVar3;
  coda_mem_data *pcVar4;
  coda_mem_special *field_type;
  coda_mem_array *pcVar5;
  long *in_FS_OFFSET;
  int local_4a0;
  char local_499;
  int num_satellites;
  char epoch_flag;
  char epoch_string [28];
  coda_type *rtype;
  coda_dynamic_type *value;
  coda_dynamic_type *base_type;
  char local_458 [2];
  char local_456;
  undefined1 local_455;
  int i;
  char str [61];
  double double_value;
  long linelength;
  char line [1000];
  ingest_info *info_local;
  
  lVar2 = ftell((FILE *)info->f);
  info->offset = lVar2;
  info->linenumber = info->linenumber + 1;
  iVar1 = get_line(info->f,(char *)&linelength);
  while( true ) {
    lVar2 = (long)iVar1;
    if (lVar2 < 0) {
      return -1;
    }
    if (lVar2 < 1) {
      return 0;
    }
    if (lVar2 < 0x23) {
      coda_set_error(-0x16,"record line length (%ld) too short (line: %ld, byte offset: %ld)",lVar2,
                     info->linenumber,info->offset);
      return -1;
    }
    if ((char)linelength != '>') break;
    pcVar3 = coda_mem_record_new(info->epoch_record_definition,(coda_dynamic_type *)0x0);
    info->epoch_record = pcVar3;
    _num_satellites = stack0xfffffffffffffbfa;
    epoch_string[0] = line[2];
    epoch_string[1] = line[3];
    epoch_string[2] = line[4];
    epoch_string[3] = line[5];
    epoch_string[4] = line[6];
    epoch_string[5] = line[7];
    epoch_string[6] = line[8];
    epoch_string[7] = line[9];
    epoch_string[8] = line[10];
    epoch_string[9] = line[0xb];
    epoch_string[10] = line[0xc];
    epoch_string[0xb] = line[0xd];
    epoch_string[0xc] = line[0xe];
    epoch_string[0xd] = line[0xf];
    epoch_string[0xe] = line[0x10];
    epoch_string[0xf] = line[0x11];
    epoch_string[0x10] = line[0x12];
    epoch_string[0x11] = line[0x13];
    epoch_string[0x12] = line[0x14];
    epoch_string[0x13] = '\0';
    unique0x00012000 = *(coda_type_special **)(*(long *)(*in_FS_OFFSET + -0x1c8) + 0x160);
    pcVar4 = coda_mem_string_new((coda_type_text *)unique0x00012000,(coda_dynamic_type *)0x0,
                                 info->product,(char *)&num_satellites);
    unique0x00012000 = *(coda_type_special **)(*(long *)(*in_FS_OFFSET + -0x1c8) + 0x168);
    field_type = coda_mem_time_new(unique0x00012000,(coda_dynamic_type *)0x0,
                                   (coda_dynamic_type *)pcVar4);
    coda_mem_record_add_field(info->epoch_record,"epoch",(coda_dynamic_type *)field_type,0);
    local_499 = line[0x17];
    unique0x00012000 = *(coda_type_special **)(*(long *)(*in_FS_OFFSET + -0x1c8) + 0x170);
    pcVar4 = coda_mem_char_new((coda_type_text *)unique0x00012000,(coda_dynamic_type *)0x0,
                               info->product,line[0x17]);
    coda_mem_record_add_field(info->epoch_record,"flag",(coda_dynamic_type *)pcVar4,0);
    local_458[0] = line[0x18];
    local_458[1] = line[0x19];
    local_456 = line[0x1a];
    local_455 = 0;
    iVar1 = __isoc99_sscanf(local_458,"%3d",&local_4a0);
    if (iVar1 != 1) {
      coda_set_error(-0x16,
                     "invalid \'number of satellites\' entry in epoch record (line: %ld, byte offset: %ld)"
                     ,info->linenumber,info->offset + 0x22);
      return -1;
    }
    if (lVar2 < 0x38) {
      stack0xfffffffffffffbe8 = 0.0;
    }
    else {
      lVar2 = coda_ascii_parse_double(line + 0x21,0xf,(double *)(str + 0x38),0);
      if (lVar2 < 0) {
        coda_add_error_message(" (line: %ld, byte offset: %ld)",info->linenumber,info->offset);
        return -1;
      }
    }
    unique0x00012000 = *(coda_type_special **)(*(long *)(*in_FS_OFFSET + -0x1c8) + 0x178);
    pcVar4 = coda_mem_double_new((coda_type_number *)unique0x00012000,(coda_dynamic_type *)0x0,
                                 info->product,stack0xfffffffffffffbe8);
    coda_mem_record_add_field
              (info->epoch_record,"receiver_clock_offset",(coda_dynamic_type *)pcVar4,0);
    if ((info->gps).sat_obs_array_definition != (coda_type_array *)0x0) {
      pcVar5 = coda_mem_array_new((info->gps).sat_obs_array_definition,(coda_dynamic_type *)0x0);
      (info->gps).sat_obs_array = pcVar5;
    }
    if ((info->glonass).sat_obs_array_definition != (coda_type_array *)0x0) {
      pcVar5 = coda_mem_array_new((info->glonass).sat_obs_array_definition,(coda_dynamic_type *)0x0)
      ;
      (info->glonass).sat_obs_array = pcVar5;
    }
    if ((info->galileo).sat_obs_array_definition != (coda_type_array *)0x0) {
      pcVar5 = coda_mem_array_new((info->galileo).sat_obs_array_definition,(coda_dynamic_type *)0x0)
      ;
      (info->galileo).sat_obs_array = pcVar5;
    }
    if ((info->sbas).sat_obs_array_definition != (coda_type_array *)0x0) {
      pcVar5 = coda_mem_array_new((info->sbas).sat_obs_array_definition,(coda_dynamic_type *)0x0);
      (info->sbas).sat_obs_array = pcVar5;
    }
    if (local_499 == '0') {
      for (base_type._4_4_ = 0; base_type._4_4_ < local_4a0; base_type._4_4_ = base_type._4_4_ + 1)
      {
        iVar1 = read_observation_record_for_satellite(info);
        if (iVar1 != 0) {
          return -1;
        }
      }
    }
    else {
      for (base_type._4_4_ = 0; base_type._4_4_ < local_4a0; base_type._4_4_ = base_type._4_4_ + 1)
      {
        lVar2 = ftell((FILE *)info->f);
        info->offset = lVar2;
        info->linenumber = info->linenumber + 1;
        iVar1 = get_line(info->f,(char *)&linelength);
        if (iVar1 < 0) {
          return -1;
        }
      }
    }
    if ((info->gps).sat_obs_array != (coda_mem_array *)0x0) {
      coda_mem_record_add_field
                (info->epoch_record,"gps",(coda_dynamic_type *)(info->gps).sat_obs_array,0);
      (info->gps).sat_obs_array = (coda_mem_array *)0x0;
    }
    if ((info->glonass).sat_obs_array != (coda_mem_array *)0x0) {
      coda_mem_record_add_field
                (info->epoch_record,"glonass",(coda_dynamic_type *)(info->glonass).sat_obs_array,0);
      (info->glonass).sat_obs_array = (coda_mem_array *)0x0;
    }
    if ((info->galileo).sat_obs_array != (coda_mem_array *)0x0) {
      coda_mem_record_add_field
                (info->epoch_record,"galileo",(coda_dynamic_type *)(info->galileo).sat_obs_array,0);
      (info->galileo).sat_obs_array = (coda_mem_array *)0x0;
    }
    if ((info->sbas).sat_obs_array != (coda_mem_array *)0x0) {
      coda_mem_record_add_field
                (info->epoch_record,"sbas",(coda_dynamic_type *)(info->sbas).sat_obs_array,0);
      (info->sbas).sat_obs_array = (coda_mem_array *)0x0;
    }
    coda_mem_array_add_element(info->records,(coda_dynamic_type *)info->epoch_record);
    info->epoch_record = (coda_mem_record *)0x0;
    lVar2 = ftell((FILE *)info->f);
    info->offset = lVar2;
    info->linenumber = info->linenumber + 1;
    iVar1 = get_line(info->f,(char *)&linelength);
  }
  coda_set_error(-0x16,"expected \'>\' as start of epoch record (line: %ld, byte offset: %ld)",
                 info->linenumber,info->offset);
  return -1;
}

Assistant:

static int read_observation_records(ingest_info *info)
{
    char line[MAX_LINE_LENGTH];
    long linelength;
    double double_value;
    char str[61];
    int i;

    info->offset = ftell(info->f);
    info->linenumber++;
    linelength = get_line(info->f, line);
    if (linelength < 0)
    {
        return -1;
    }
    while (linelength > 0)
    {
        coda_dynamic_type *base_type;
        coda_dynamic_type *value;
        coda_type *rtype;
        char epoch_string[28];
        char epoch_flag;
        int num_satellites;

        if (linelength < 35)
        {
            coda_set_error(CODA_ERROR_FILE_READ, "record line length (%ld) too short (line: %ld, byte offset: %ld)",
                           linelength, info->linenumber, info->offset);
            return -1;
        }
        if (line[0] != '>')
        {
            coda_set_error(CODA_ERROR_FILE_READ, "expected '>' as start of epoch record (line: %ld, byte offset: %ld)",
                           info->linenumber, info->offset);
            return -1;
        }

        info->epoch_record = coda_mem_record_new(info->epoch_record_definition, NULL);

        memcpy(epoch_string, &line[2], 27);
        epoch_string[27] = '\0';
        rtype = rinex_type[rinex_epoch_string];
        base_type = (coda_dynamic_type *)coda_mem_string_new((coda_type_text *)rtype, NULL, info->product,
                                                             epoch_string);
        rtype = rinex_type[rinex_obs_epoch];
        value = (coda_dynamic_type *)coda_mem_time_new((coda_type_special *)rtype, NULL, base_type);
        coda_mem_record_add_field(info->epoch_record, "epoch", value, 0);

        epoch_flag = line[31];
        rtype = rinex_type[rinex_obs_epoch_flag];
        value = (coda_dynamic_type *)coda_mem_char_new((coda_type_text *)rtype, NULL, info->product, epoch_flag);
        coda_mem_record_add_field(info->epoch_record, "flag", value, 0);

        memcpy(str, &line[32], 3);
        str[3] = '\0';
        if (sscanf(str, "%3d", &num_satellites) != 1)
        {
            coda_set_error(CODA_ERROR_FILE_READ, "invalid 'number of satellites' entry in epoch record "
                           "(line: %ld, byte offset: %ld)", info->linenumber, info->offset + 34);
            return -1;
        }

        if (linelength >= 56)
        {
            if (coda_ascii_parse_double(&line[41], 15, &double_value, 0) < 0)
            {
                coda_add_error_message(" (line: %ld, byte offset: %ld)", info->linenumber, info->offset);
                return -1;
            }
        }
        else
        {
            double_value = 0;
        }
        rtype = rinex_type[rinex_receiver_clock_offset];
        value = (coda_dynamic_type *)coda_mem_double_new((coda_type_number *)rtype, NULL, info->product, double_value);
        coda_mem_record_add_field(info->epoch_record, "receiver_clock_offset", value, 0);

        if (info->gps.sat_obs_array_definition != NULL)
        {
            info->gps.sat_obs_array = coda_mem_array_new(info->gps.sat_obs_array_definition, NULL);
        }
        if (info->glonass.sat_obs_array_definition != NULL)
        {
            info->glonass.sat_obs_array = coda_mem_array_new(info->glonass.sat_obs_array_definition, NULL);
        }
        if (info->galileo.sat_obs_array_definition != NULL)
        {
            info->galileo.sat_obs_array = coda_mem_array_new(info->galileo.sat_obs_array_definition, NULL);
        }
        if (info->sbas.sat_obs_array_definition != NULL)
        {
            info->sbas.sat_obs_array = coda_mem_array_new(info->sbas.sat_obs_array_definition, NULL);
        }

        /* check epoch flag */
        if (epoch_flag != '0')
        {
            /* we skip the remaining part of this record if epoch flag != 0 */
            for (i = 0; i < num_satellites; i++)
            {
                info->offset = ftell(info->f);
                info->linenumber++;
                linelength = get_line(info->f, line);
                if (linelength < 0)
                {
                    return -1;
                }
            }
        }
        else
        {
            for (i = 0; i < num_satellites; i++)
            {
                if (read_observation_record_for_satellite(info) != 0)
                {
                    return -1;
                }
            }
        }

        if (info->gps.sat_obs_array != NULL)
        {
            coda_mem_record_add_field(info->epoch_record, "gps", (coda_dynamic_type *)info->gps.sat_obs_array, 0);
            info->gps.sat_obs_array = NULL;
        }
        if (info->glonass.sat_obs_array != NULL)
        {
            coda_mem_record_add_field(info->epoch_record, "glonass", (coda_dynamic_type *)info->glonass.sat_obs_array,
                                      0);
            info->glonass.sat_obs_array = NULL;
        }
        if (info->galileo.sat_obs_array != NULL)
        {
            coda_mem_record_add_field(info->epoch_record, "galileo", (coda_dynamic_type *)info->galileo.sat_obs_array,
                                      0);
            info->galileo.sat_obs_array = NULL;
        }
        if (info->sbas.sat_obs_array != NULL)
        {
            coda_mem_record_add_field(info->epoch_record, "sbas", (coda_dynamic_type *)info->sbas.sat_obs_array, 0);
            info->sbas.sat_obs_array = NULL;
        }
        coda_mem_array_add_element(info->records, (coda_dynamic_type *)info->epoch_record);
        info->epoch_record = NULL;

        info->offset = ftell(info->f);
        info->linenumber++;
        linelength = get_line(info->f, line);
        if (linelength < 0)
        {
            return -1;
        }
    }

    return 0;
}